

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O2

expr_t __thiscall DL::DataLisp::expression(DataLisp *this,string_t *name)

{
  size_type sVar1;
  mapped_type *pp_Var2;
  mapped_type p_Var3;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>_>
          ::count(&this->mInternal->mExpressions,name);
  if (sVar1 == 0) {
    p_Var3 = (mapped_type)0x0;
  }
  else {
    pp_Var2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>_>
              ::at(&this->mInternal->mExpressions,name);
    p_Var3 = *pp_Var2;
  }
  return (expr_t)p_Var3;
}

Assistant:

expr_t DataLisp::expression(const string_t& name)
{
	if (mInternal->mExpressions.count(name))
		return mInternal->mExpressions.at(name);
	else
		return nullptr;
}